

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wsntopologybasedenergy.cpp
# Opt level: O3

void __thiscall WSNTopologyBasedEnergy::TopLayer3SentSink(WSNTopologyBasedEnergy *this)

{
  WSNNode *this_00;
  WSNNode *pWVar1;
  Scalar *pSVar2;
  double *pdVar3;
  double dVar4;
  undefined8 uVar5;
  undefined8 uVar6;
  undefined8 uVar7;
  undefined8 uVar8;
  undefined8 uVar9;
  undefined8 uVar10;
  undefined8 uVar11;
  undefined8 uVar12;
  undefined8 uVar13;
  undefined8 uVar14;
  Size **ppSVar15;
  int iVar16;
  long lVar17;
  WSNTopologyBasedEnergy *this_01;
  WSNTopologyBasedEnergy *pWVar18;
  WSNNode *pWVar19;
  vector<int,_std::allocator<int>_> _array;
  Mat tempimg;
  int *local_740;
  _InputArray local_720;
  Scalar *local_708;
  WSNNode *local_700;
  _InputArray local_6f8;
  undefined8 uStack_6e0;
  Scalar *local_6d0;
  Scalar *local_6c8;
  Scalar *local_6c0;
  WSNNode *local_6b8;
  Scalar *local_6b0;
  WSNNode *local_6a8;
  Scalar *local_6a0;
  WSNNode *local_698;
  undefined8 local_690;
  undefined8 local_688;
  undefined8 local_680;
  vector<int,_std::allocator<int>_> local_678;
  undefined8 local_660;
  int local_658;
  undefined4 uStack_654;
  undefined4 uStack_650;
  undefined4 uStack_64c;
  WSNNode local_648;
  WSNNode local_608;
  WSNNode local_5c8;
  WSNNode local_588;
  WSNNode local_548;
  WSNNode local_508;
  WSNNode local_4c8;
  WSNNode local_488;
  WSNNode local_448;
  WSNNode local_408;
  long *local_3c8 [2];
  long local_3b8 [10];
  WSNNode local_368;
  WSNNode local_328;
  WSNNode local_2e8;
  WSNNode local_2a8;
  WSNNode local_268;
  WSNNode local_228;
  WSNNode local_1e8;
  WSNNode local_1a8;
  WSNNode local_168;
  WSNNode local_128;
  WSNNode local_e8;
  WSNNode local_a8;
  undefined1 local_70 [64];
  
  SelectServalNode(&local_678,this);
  local_740 = local_678.super__Vector_base<int,_std::allocator<int>_>._M_impl.
              super__Vector_impl_data._M_start;
  if (local_678.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start !=
      local_678.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_finish) {
    local_6a8 = this->LayerLeaderNode;
    pWVar19 = this->LayerLeaderNode + 3;
    ppSVar15 = (Size **)&local_6f8.sz;
    local_6b8 = this->LayerLeaderNode + 4;
    local_6c0 = &this->LayerLeaderNode[4].color;
    local_708 = &this->LayerLeaderNode[3].color;
    local_698 = &this->sink;
    local_6a0 = &(this->sink).color;
    local_658 = 0;
    uStack_654 = 0;
    uStack_650 = 0;
    uStack_64c = 0x406fe000;
    this_00 = this->LayerLeaderNode + 2;
    local_6d0 = &this->LayerLeaderNode[2].color;
    local_700 = this->LayerLeaderNode + 1;
    local_6c8 = &this->LayerLeaderNode[1].color;
    local_6b0 = &this->LayerLeaderNode[0].color;
    do {
      cv::Mat::clone();
      SelectLeaderID(this);
      local_720.sz.width = 0;
      local_720.sz.height = 0;
      local_720.flags = 0x3010000;
      local_660 = 0;
      local_680._0_4_ = pWVar19->x;
      local_680._4_4_ = pWVar19->y;
      local_6f8._0_8_ = (Size *)0x4046800000000000;
      local_6f8.obj = (void *)0x4062c00000000000;
      local_6f8.sz.width = 0;
      local_6f8.sz.height = 0x40468000;
      uStack_6e0 = 0;
      local_720.obj = (Mat *)local_3c8;
      cv::line(&local_720,&local_660,&local_680,(string *)&local_6f8,1,8,0);
      lVar17 = 0x18e8;
      do {
        local_720.sz.width = 0;
        local_720.sz.height = 0;
        local_720.flags = 0x3010000;
        local_688 = *(undefined8 *)((long)(&(this->sink).color + -4) + lVar17);
        local_690 = *(undefined8 *)
                     ((long)(this->sink).color.super_Vec<double,_4>.super_Matx<double,_4,_1>.val +
                     lVar17 + -0x48);
        local_6f8._0_8_ = CONCAT44(uStack_654,local_658);
        local_6f8.obj = (void *)CONCAT44(uStack_64c,uStack_650);
        local_6f8.sz.width = 0;
        local_6f8.sz.height = 0;
        uStack_6e0 = 0;
        local_720.obj = (Mat *)local_3c8;
        cv::line(&local_720,&local_688,&local_690,(string *)&local_6f8,1,8,0);
        local_6f8._0_8_ = ppSVar15;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_6f8,"WSN","");
        local_720.sz.width = 0;
        local_720.sz.height = 0;
        local_720.flags = 0x1010000;
        local_720.obj = (Mat *)local_3c8;
        cv::imshow((string *)&local_6f8,&local_720);
        if ((Size **)local_6f8._0_8_ != ppSVar15) {
          operator_delete((void *)local_6f8._0_8_,(long)local_6f8.sz + 1);
        }
        lVar17 = lVar17 + 0x38;
      } while (lVar17 != 0x19c8);
      if (this->Test != false) {
        cv::waitKey(100);
      }
      iVar16 = WSNNode::layer(this->node + *local_740);
      if (iVar16 == 0) {
        dVar4 = this->alpha;
        local_408.leaderID = local_6a8->leaderID;
        local_408.id = local_6a8->id;
        uVar7._0_4_ = local_6a8->x;
        uVar7._4_4_ = local_6a8->y;
        local_408.energy = local_6a8->energy;
        local_408.color.super_Vec<double,_4>.super_Matx<double,_4,_1>.val[0] =
             (local_6b0->super_Vec<double,_4>).super_Matx<double,_4,_1>.val[0];
        local_408.color.super_Vec<double,_4>.super_Matx<double,_4,_1>.val[1] =
             (local_6b0->super_Vec<double,_4>).super_Matx<double,_4,_1>.val[1];
        local_408.color.super_Vec<double,_4>.super_Matx<double,_4,_1>.val[2] =
             (local_6b0->super_Vec<double,_4>).super_Matx<double,_4,_1>.val[2];
        local_408.color.super_Vec<double,_4>.super_Matx<double,_4,_1>.val[3] =
             (local_6b0->super_Vec<double,_4>).super_Matx<double,_4,_1>.val[3];
        local_448.leaderID = local_700->leaderID;
        local_448.id = local_700->id;
        uVar8._0_4_ = local_700->x;
        uVar8._4_4_ = local_700->y;
        local_448.energy = local_700->energy;
        local_448.color.super_Vec<double,_4>.super_Matx<double,_4,_1>.val[0] =
             (local_6c8->super_Vec<double,_4>).super_Matx<double,_4,_1>.val[0];
        local_448.color.super_Vec<double,_4>.super_Matx<double,_4,_1>.val[1] =
             (local_6c8->super_Vec<double,_4>).super_Matx<double,_4,_1>.val[1];
        local_448.color.super_Vec<double,_4>.super_Matx<double,_4,_1>.val[2] =
             (local_6c8->super_Vec<double,_4>).super_Matx<double,_4,_1>.val[2];
        local_448.color.super_Vec<double,_4>.super_Matx<double,_4,_1>.val[3] =
             (local_6c8->super_Vec<double,_4>).super_Matx<double,_4,_1>.val[3];
        local_448._0_8_ = uVar8;
        local_408._0_8_ = uVar7;
        iVar16 = WSNNode::GetNodeID(local_6a8);
        this->node[iVar16].energy =
             this->node[iVar16].energy -
             (dVar4 * (double)(((int)uVar7 - (int)uVar8) * ((int)uVar7 - (int)uVar8) +
                              (uVar7._4_4_ - uVar8._4_4_) * (uVar7._4_4_ - uVar8._4_4_)) + 1.0);
        WSNNode::~WSNNode(&local_448);
        WSNNode::~WSNNode(&local_408);
        iVar16 = *local_740;
        local_128.leaderID = this->node[iVar16].leaderID;
        local_128.id = this->node[iVar16].id;
        pWVar1 = this->node + iVar16;
        local_128.x = pWVar1->x;
        local_128.y = pWVar1->y;
        local_128.energy = pWVar1->energy;
        pSVar2 = &this->node[iVar16].color;
        local_128.color.super_Vec<double,_4>.super_Matx<double,_4,_1>.val[0] =
             (pSVar2->super_Vec<double,_4>).super_Matx<double,_4,_1>.val[0];
        local_128.color.super_Vec<double,_4>.super_Matx<double,_4,_1>.val[1] =
             (pSVar2->super_Vec<double,_4>).super_Matx<double,_4,_1>.val[1];
        pdVar3 = this->node[iVar16].color.super_Vec<double,_4>.super_Matx<double,_4,_1>.val + 2;
        local_128.color.super_Vec<double,_4>.super_Matx<double,_4,_1>.val[2] = *pdVar3;
        local_128.color.super_Vec<double,_4>.super_Matx<double,_4,_1>.val[3] = pdVar3[1];
        local_168.leaderID = local_6a8->leaderID;
        local_168.id = local_6a8->id;
        local_168.x = local_6a8->x;
        local_168.y = local_6a8->y;
        local_168.energy = local_6a8->energy;
        local_168.color.super_Vec<double,_4>.super_Matx<double,_4,_1>.val[0] =
             (local_6b0->super_Vec<double,_4>).super_Matx<double,_4,_1>.val[0];
        local_168.color.super_Vec<double,_4>.super_Matx<double,_4,_1>.val[1] =
             (local_6b0->super_Vec<double,_4>).super_Matx<double,_4,_1>.val[1];
        local_168.color.super_Vec<double,_4>.super_Matx<double,_4,_1>.val[2] =
             (local_6b0->super_Vec<double,_4>).super_Matx<double,_4,_1>.val[2];
        local_168.color.super_Vec<double,_4>.super_Matx<double,_4,_1>.val[3] =
             (local_6b0->super_Vec<double,_4>).super_Matx<double,_4,_1>.val[3];
        this->node[iVar16].energy =
             this->node[iVar16].energy -
             ((double)((local_128.y - local_168.y) * (local_128.y - local_168.y) +
                      (local_128.x - local_168.x) * (local_128.x - local_168.x)) * this->alpha + 0.5
             );
        WSNNode::~WSNNode(&local_168);
        WSNNode::~WSNNode(&local_128);
        iVar16 = WSNNode::GetNodeID(local_700);
        this->node[iVar16].energy = this->node[iVar16].energy + -1.0;
        iVar16 = WSNNode::GetNodeID(this_00);
        this->node[iVar16].energy = this->node[iVar16].energy + -1.0;
        iVar16 = WSNNode::GetNodeID(pWVar19);
LAB_00109fc7:
        this->node[iVar16].energy = this->node[iVar16].energy + -1.0;
      }
      else {
        iVar16 = WSNNode::layer(this->node + *local_740);
        if (iVar16 == 1) {
          dVar4 = this->alpha;
          local_488.leaderID = local_700->leaderID;
          local_488.id = local_700->id;
          uVar5._0_4_ = local_700->x;
          uVar5._4_4_ = local_700->y;
          local_488.energy = local_700->energy;
          local_488.color.super_Vec<double,_4>.super_Matx<double,_4,_1>.val[0] =
               (local_6c8->super_Vec<double,_4>).super_Matx<double,_4,_1>.val[0];
          local_488.color.super_Vec<double,_4>.super_Matx<double,_4,_1>.val[1] =
               (local_6c8->super_Vec<double,_4>).super_Matx<double,_4,_1>.val[1];
          local_488.color.super_Vec<double,_4>.super_Matx<double,_4,_1>.val[2] =
               (local_6c8->super_Vec<double,_4>).super_Matx<double,_4,_1>.val[2];
          local_488.color.super_Vec<double,_4>.super_Matx<double,_4,_1>.val[3] =
               (local_6c8->super_Vec<double,_4>).super_Matx<double,_4,_1>.val[3];
          local_4c8.leaderID = this->LayerLeaderNode[2].leaderID;
          local_4c8.id = this->LayerLeaderNode[2].id;
          uVar6._0_4_ = this_00->x;
          uVar6._4_4_ = this_00->y;
          local_4c8.energy = this->LayerLeaderNode[2].energy;
          local_4c8.color.super_Vec<double,_4>.super_Matx<double,_4,_1>.val[0] =
               (local_6d0->super_Vec<double,_4>).super_Matx<double,_4,_1>.val[0];
          local_4c8.color.super_Vec<double,_4>.super_Matx<double,_4,_1>.val[1] =
               (local_6d0->super_Vec<double,_4>).super_Matx<double,_4,_1>.val[1];
          local_4c8.color.super_Vec<double,_4>.super_Matx<double,_4,_1>.val[2] =
               (local_6d0->super_Vec<double,_4>).super_Matx<double,_4,_1>.val[2];
          local_4c8.color.super_Vec<double,_4>.super_Matx<double,_4,_1>.val[3] =
               (local_6d0->super_Vec<double,_4>).super_Matx<double,_4,_1>.val[3];
          local_4c8._0_8_ = uVar6;
          local_488._0_8_ = uVar5;
          iVar16 = WSNNode::GetNodeID(local_700);
          this->node[iVar16].energy =
               this->node[iVar16].energy -
               (dVar4 * (double)(((int)uVar5 - (int)uVar6) * ((int)uVar5 - (int)uVar6) +
                                (uVar5._4_4_ - uVar6._4_4_) * (uVar5._4_4_ - uVar6._4_4_)) + 1.0);
          WSNNode::~WSNNode(&local_4c8);
          WSNNode::~WSNNode(&local_488);
          iVar16 = *local_740;
          local_1a8.leaderID = this->node[iVar16].leaderID;
          local_1a8.id = this->node[iVar16].id;
          pWVar1 = this->node + iVar16;
          local_1a8.x = pWVar1->x;
          local_1a8.y = pWVar1->y;
          local_1a8.energy = pWVar1->energy;
          pSVar2 = &this->node[iVar16].color;
          local_1a8.color.super_Vec<double,_4>.super_Matx<double,_4,_1>.val[0] =
               (pSVar2->super_Vec<double,_4>).super_Matx<double,_4,_1>.val[0];
          local_1a8.color.super_Vec<double,_4>.super_Matx<double,_4,_1>.val[1] =
               (pSVar2->super_Vec<double,_4>).super_Matx<double,_4,_1>.val[1];
          pdVar3 = this->node[iVar16].color.super_Vec<double,_4>.super_Matx<double,_4,_1>.val + 2;
          local_1a8.color.super_Vec<double,_4>.super_Matx<double,_4,_1>.val[2] = *pdVar3;
          local_1a8.color.super_Vec<double,_4>.super_Matx<double,_4,_1>.val[3] = pdVar3[1];
          local_1e8.leaderID = local_700->leaderID;
          local_1e8.id = local_700->id;
          local_1e8.x = local_700->x;
          local_1e8.y = local_700->y;
          local_1e8.energy = local_700->energy;
          local_1e8.color.super_Vec<double,_4>.super_Matx<double,_4,_1>.val[0] =
               (local_6c8->super_Vec<double,_4>).super_Matx<double,_4,_1>.val[0];
          local_1e8.color.super_Vec<double,_4>.super_Matx<double,_4,_1>.val[1] =
               (local_6c8->super_Vec<double,_4>).super_Matx<double,_4,_1>.val[1];
          local_1e8.color.super_Vec<double,_4>.super_Matx<double,_4,_1>.val[2] =
               (local_6c8->super_Vec<double,_4>).super_Matx<double,_4,_1>.val[2];
          local_1e8.color.super_Vec<double,_4>.super_Matx<double,_4,_1>.val[3] =
               (local_6c8->super_Vec<double,_4>).super_Matx<double,_4,_1>.val[3];
          this->node[iVar16].energy =
               this->node[iVar16].energy -
               ((double)((local_1a8.y - local_1e8.y) * (local_1a8.y - local_1e8.y) +
                        (local_1a8.x - local_1e8.x) * (local_1a8.x - local_1e8.x)) * this->alpha +
               0.5);
          WSNNode::~WSNNode(&local_1e8);
          WSNNode::~WSNNode(&local_1a8);
          iVar16 = WSNNode::GetNodeID(this_00);
          this->node[iVar16].energy = this->node[iVar16].energy + -1.0;
          iVar16 = WSNNode::GetNodeID(pWVar19);
          goto LAB_00109fc7;
        }
        iVar16 = WSNNode::layer(this->node + *local_740);
        if (iVar16 == 2) {
          dVar4 = this->alpha;
          local_508.leaderID = this->LayerLeaderNode[2].leaderID;
          local_508.id = this->LayerLeaderNode[2].id;
          uVar9._0_4_ = this_00->x;
          uVar9._4_4_ = this_00->y;
          local_508.energy = this->LayerLeaderNode[2].energy;
          local_508.color.super_Vec<double,_4>.super_Matx<double,_4,_1>.val[0] =
               (local_6d0->super_Vec<double,_4>).super_Matx<double,_4,_1>.val[0];
          local_508.color.super_Vec<double,_4>.super_Matx<double,_4,_1>.val[1] =
               (local_6d0->super_Vec<double,_4>).super_Matx<double,_4,_1>.val[1];
          local_508.color.super_Vec<double,_4>.super_Matx<double,_4,_1>.val[2] =
               (local_6d0->super_Vec<double,_4>).super_Matx<double,_4,_1>.val[2];
          local_508.color.super_Vec<double,_4>.super_Matx<double,_4,_1>.val[3] =
               (local_6d0->super_Vec<double,_4>).super_Matx<double,_4,_1>.val[3];
          local_548.leaderID = this->LayerLeaderNode[3].leaderID;
          local_548.id = this->LayerLeaderNode[3].id;
          uVar10._0_4_ = pWVar19->x;
          uVar10._4_4_ = pWVar19->y;
          local_548.energy = this->LayerLeaderNode[3].energy;
          local_548.color.super_Vec<double,_4>.super_Matx<double,_4,_1>.val[0] =
               (local_708->super_Vec<double,_4>).super_Matx<double,_4,_1>.val[0];
          local_548.color.super_Vec<double,_4>.super_Matx<double,_4,_1>.val[1] =
               (local_708->super_Vec<double,_4>).super_Matx<double,_4,_1>.val[1];
          local_548.color.super_Vec<double,_4>.super_Matx<double,_4,_1>.val[2] =
               (local_708->super_Vec<double,_4>).super_Matx<double,_4,_1>.val[2];
          local_548.color.super_Vec<double,_4>.super_Matx<double,_4,_1>.val[3] =
               (local_708->super_Vec<double,_4>).super_Matx<double,_4,_1>.val[3];
          local_548._0_8_ = uVar10;
          local_508._0_8_ = uVar9;
          iVar16 = WSNNode::GetNodeID(this_00);
          this->node[iVar16].energy =
               this->node[iVar16].energy -
               (dVar4 * (double)(((int)uVar9 - (int)uVar10) * ((int)uVar9 - (int)uVar10) +
                                (uVar9._4_4_ - uVar10._4_4_) * (uVar9._4_4_ - uVar10._4_4_)) + 1.0);
          WSNNode::~WSNNode(&local_548);
          WSNNode::~WSNNode(&local_508);
          iVar16 = *local_740;
          local_228.leaderID = this->node[iVar16].leaderID;
          local_228.id = this->node[iVar16].id;
          pWVar1 = this->node + iVar16;
          local_228.x = pWVar1->x;
          local_228.y = pWVar1->y;
          local_228.energy = pWVar1->energy;
          pSVar2 = &this->node[iVar16].color;
          local_228.color.super_Vec<double,_4>.super_Matx<double,_4,_1>.val[0] =
               (pSVar2->super_Vec<double,_4>).super_Matx<double,_4,_1>.val[0];
          local_228.color.super_Vec<double,_4>.super_Matx<double,_4,_1>.val[1] =
               (pSVar2->super_Vec<double,_4>).super_Matx<double,_4,_1>.val[1];
          pdVar3 = this->node[iVar16].color.super_Vec<double,_4>.super_Matx<double,_4,_1>.val + 2;
          local_228.color.super_Vec<double,_4>.super_Matx<double,_4,_1>.val[2] = *pdVar3;
          local_228.color.super_Vec<double,_4>.super_Matx<double,_4,_1>.val[3] = pdVar3[1];
          local_268.leaderID = this->LayerLeaderNode[2].leaderID;
          local_268.id = this->LayerLeaderNode[2].id;
          local_268.x = this_00->x;
          local_268.y = this_00->y;
          local_268.energy = this->LayerLeaderNode[2].energy;
          local_268.color.super_Vec<double,_4>.super_Matx<double,_4,_1>.val[0] =
               (local_6d0->super_Vec<double,_4>).super_Matx<double,_4,_1>.val[0];
          local_268.color.super_Vec<double,_4>.super_Matx<double,_4,_1>.val[1] =
               (local_6d0->super_Vec<double,_4>).super_Matx<double,_4,_1>.val[1];
          local_268.color.super_Vec<double,_4>.super_Matx<double,_4,_1>.val[2] =
               (local_6d0->super_Vec<double,_4>).super_Matx<double,_4,_1>.val[2];
          local_268.color.super_Vec<double,_4>.super_Matx<double,_4,_1>.val[3] =
               (local_6d0->super_Vec<double,_4>).super_Matx<double,_4,_1>.val[3];
          this->node[iVar16].energy =
               this->node[iVar16].energy -
               ((double)((local_228.y - local_268.y) * (local_228.y - local_268.y) +
                        (local_228.x - local_268.x) * (local_228.x - local_268.x)) * this->alpha +
               0.5);
          WSNNode::~WSNNode(&local_268);
          WSNNode::~WSNNode(&local_228);
          iVar16 = WSNNode::GetNodeID(pWVar19);
          goto LAB_00109fc7;
        }
        iVar16 = WSNNode::layer(this->node + *local_740);
        dVar4 = this->alpha;
        if (iVar16 != 3) {
          local_608.leaderID = local_6b8->leaderID;
          local_608.id = local_6b8->id;
          uVar13._0_4_ = local_6b8->x;
          uVar13._4_4_ = local_6b8->y;
          local_608.energy = local_6b8->energy;
          local_608.color.super_Vec<double,_4>.super_Matx<double,_4,_1>.val[0] =
               (local_6c0->super_Vec<double,_4>).super_Matx<double,_4,_1>.val[0];
          local_608.color.super_Vec<double,_4>.super_Matx<double,_4,_1>.val[1] =
               (local_6c0->super_Vec<double,_4>).super_Matx<double,_4,_1>.val[1];
          local_608.color.super_Vec<double,_4>.super_Matx<double,_4,_1>.val[2] =
               (local_6c0->super_Vec<double,_4>).super_Matx<double,_4,_1>.val[2];
          local_608.color.super_Vec<double,_4>.super_Matx<double,_4,_1>.val[3] =
               (local_6c0->super_Vec<double,_4>).super_Matx<double,_4,_1>.val[3];
          local_648.leaderID = this->LayerLeaderNode[3].leaderID;
          local_648.id = this->LayerLeaderNode[3].id;
          uVar14._0_4_ = pWVar19->x;
          uVar14._4_4_ = pWVar19->y;
          local_648.energy = this->LayerLeaderNode[3].energy;
          local_648.color.super_Vec<double,_4>.super_Matx<double,_4,_1>.val[0] =
               (local_708->super_Vec<double,_4>).super_Matx<double,_4,_1>.val[0];
          local_648.color.super_Vec<double,_4>.super_Matx<double,_4,_1>.val[1] =
               (local_708->super_Vec<double,_4>).super_Matx<double,_4,_1>.val[1];
          local_648.color.super_Vec<double,_4>.super_Matx<double,_4,_1>.val[2] =
               (local_708->super_Vec<double,_4>).super_Matx<double,_4,_1>.val[2];
          local_648.color.super_Vec<double,_4>.super_Matx<double,_4,_1>.val[3] =
               (local_708->super_Vec<double,_4>).super_Matx<double,_4,_1>.val[3];
          local_648._0_8_ = uVar14;
          local_608._0_8_ = uVar13;
          iVar16 = WSNNode::GetNodeID(local_6b8);
          this->node[iVar16].energy =
               this->node[iVar16].energy -
               (dVar4 * (double)(((int)uVar13 - (int)uVar14) * ((int)uVar13 - (int)uVar14) +
                                (uVar13._4_4_ - uVar14._4_4_) * (uVar13._4_4_ - uVar14._4_4_)) + 1.0
               );
          WSNNode::~WSNNode(&local_648);
          WSNNode::~WSNNode(&local_608);
          iVar16 = *local_740;
          local_328.leaderID = this->node[iVar16].leaderID;
          local_328.id = this->node[iVar16].id;
          pWVar1 = this->node + iVar16;
          local_328.x = pWVar1->x;
          local_328.y = pWVar1->y;
          local_328.energy = pWVar1->energy;
          pSVar2 = &this->node[iVar16].color;
          local_328.color.super_Vec<double,_4>.super_Matx<double,_4,_1>.val[0] =
               (pSVar2->super_Vec<double,_4>).super_Matx<double,_4,_1>.val[0];
          local_328.color.super_Vec<double,_4>.super_Matx<double,_4,_1>.val[1] =
               (pSVar2->super_Vec<double,_4>).super_Matx<double,_4,_1>.val[1];
          pdVar3 = this->node[iVar16].color.super_Vec<double,_4>.super_Matx<double,_4,_1>.val + 2;
          local_328.color.super_Vec<double,_4>.super_Matx<double,_4,_1>.val[2] = *pdVar3;
          local_328.color.super_Vec<double,_4>.super_Matx<double,_4,_1>.val[3] = pdVar3[1];
          local_368.leaderID = local_6b8->leaderID;
          local_368.id = local_6b8->id;
          local_368.x = local_6b8->x;
          local_368.y = local_6b8->y;
          local_368.energy = local_6b8->energy;
          local_368.color.super_Vec<double,_4>.super_Matx<double,_4,_1>.val[0] =
               (local_6c0->super_Vec<double,_4>).super_Matx<double,_4,_1>.val[0];
          local_368.color.super_Vec<double,_4>.super_Matx<double,_4,_1>.val[1] =
               (local_6c0->super_Vec<double,_4>).super_Matx<double,_4,_1>.val[1];
          local_368.color.super_Vec<double,_4>.super_Matx<double,_4,_1>.val[2] =
               (local_6c0->super_Vec<double,_4>).super_Matx<double,_4,_1>.val[2];
          local_368.color.super_Vec<double,_4>.super_Matx<double,_4,_1>.val[3] =
               (local_6c0->super_Vec<double,_4>).super_Matx<double,_4,_1>.val[3];
          this->node[iVar16].energy =
               this->node[iVar16].energy -
               ((double)((local_328.y - local_368.y) * (local_328.y - local_368.y) +
                        (local_328.x - local_368.x) * (local_328.x - local_368.x)) * this->alpha +
               0.5);
          WSNNode::~WSNNode(&local_368);
          WSNNode::~WSNNode(&local_328);
          iVar16 = WSNNode::GetNodeID(pWVar19);
          goto LAB_00109fc7;
        }
        local_588.leaderID = this->LayerLeaderNode[3].leaderID;
        local_588.id = this->LayerLeaderNode[3].id;
        uVar11._0_4_ = pWVar19->x;
        uVar11._4_4_ = pWVar19->y;
        local_588.energy = this->LayerLeaderNode[3].energy;
        local_588.color.super_Vec<double,_4>.super_Matx<double,_4,_1>.val[0] =
             (local_708->super_Vec<double,_4>).super_Matx<double,_4,_1>.val[0];
        local_588.color.super_Vec<double,_4>.super_Matx<double,_4,_1>.val[1] =
             (local_708->super_Vec<double,_4>).super_Matx<double,_4,_1>.val[1];
        local_588.color.super_Vec<double,_4>.super_Matx<double,_4,_1>.val[2] =
             (local_708->super_Vec<double,_4>).super_Matx<double,_4,_1>.val[2];
        local_588.color.super_Vec<double,_4>.super_Matx<double,_4,_1>.val[3] =
             (local_708->super_Vec<double,_4>).super_Matx<double,_4,_1>.val[3];
        local_5c8.leaderID = local_698->leaderID;
        local_5c8.id = local_698->id;
        uVar12._0_4_ = local_698->x;
        uVar12._4_4_ = local_698->y;
        local_5c8.energy = local_698->energy;
        local_5c8.color.super_Vec<double,_4>.super_Matx<double,_4,_1>.val[0] =
             (local_6a0->super_Vec<double,_4>).super_Matx<double,_4,_1>.val[0];
        local_5c8.color.super_Vec<double,_4>.super_Matx<double,_4,_1>.val[1] =
             (local_6a0->super_Vec<double,_4>).super_Matx<double,_4,_1>.val[1];
        local_5c8.color.super_Vec<double,_4>.super_Matx<double,_4,_1>.val[2] =
             (local_6a0->super_Vec<double,_4>).super_Matx<double,_4,_1>.val[2];
        local_5c8.color.super_Vec<double,_4>.super_Matx<double,_4,_1>.val[3] =
             (local_6a0->super_Vec<double,_4>).super_Matx<double,_4,_1>.val[3];
        local_5c8._0_8_ = uVar12;
        local_588._0_8_ = uVar11;
        iVar16 = WSNNode::GetNodeID(pWVar19);
        this->node[iVar16].energy =
             this->node[iVar16].energy -
             (dVar4 * (double)(((int)uVar11 - (int)uVar12) * ((int)uVar11 - (int)uVar12) +
                              (uVar11._4_4_ - uVar12._4_4_) * (uVar11._4_4_ - uVar12._4_4_)) + 1.0);
        WSNNode::~WSNNode(&local_5c8);
        WSNNode::~WSNNode(&local_588);
        iVar16 = *local_740;
        local_2a8.leaderID = this->node[iVar16].leaderID;
        local_2a8.id = this->node[iVar16].id;
        pWVar1 = this->node + iVar16;
        local_2a8.x = pWVar1->x;
        local_2a8.y = pWVar1->y;
        local_2a8.energy = pWVar1->energy;
        pSVar2 = &this->node[iVar16].color;
        local_2a8.color.super_Vec<double,_4>.super_Matx<double,_4,_1>.val[0] =
             (pSVar2->super_Vec<double,_4>).super_Matx<double,_4,_1>.val[0];
        local_2a8.color.super_Vec<double,_4>.super_Matx<double,_4,_1>.val[1] =
             (pSVar2->super_Vec<double,_4>).super_Matx<double,_4,_1>.val[1];
        pdVar3 = this->node[iVar16].color.super_Vec<double,_4>.super_Matx<double,_4,_1>.val + 2;
        local_2a8.color.super_Vec<double,_4>.super_Matx<double,_4,_1>.val[2] = *pdVar3;
        local_2a8.color.super_Vec<double,_4>.super_Matx<double,_4,_1>.val[3] = pdVar3[1];
        local_2e8.leaderID = this->LayerLeaderNode[3].leaderID;
        local_2e8.id = this->LayerLeaderNode[3].id;
        local_2e8.x = pWVar19->x;
        local_2e8.y = pWVar19->y;
        local_2e8.energy = this->LayerLeaderNode[3].energy;
        local_2e8.color.super_Vec<double,_4>.super_Matx<double,_4,_1>.val[0] =
             (local_708->super_Vec<double,_4>).super_Matx<double,_4,_1>.val[0];
        local_2e8.color.super_Vec<double,_4>.super_Matx<double,_4,_1>.val[1] =
             (local_708->super_Vec<double,_4>).super_Matx<double,_4,_1>.val[1];
        local_2e8.color.super_Vec<double,_4>.super_Matx<double,_4,_1>.val[2] =
             (local_708->super_Vec<double,_4>).super_Matx<double,_4,_1>.val[2];
        local_2e8.color.super_Vec<double,_4>.super_Matx<double,_4,_1>.val[3] =
             (local_708->super_Vec<double,_4>).super_Matx<double,_4,_1>.val[3];
        this->node[iVar16].energy =
             this->node[iVar16].energy -
             ((double)((local_2a8.y - local_2e8.y) * (local_2a8.y - local_2e8.y) +
                      (local_2a8.x - local_2e8.x) * (local_2a8.x - local_2e8.x)) * this->alpha + 0.5
             );
        WSNNode::~WSNNode(&local_2e8);
        WSNNode::~WSNNode(&local_2a8);
      }
      iVar16 = *local_740;
      local_a8.leaderID = this->node[iVar16].leaderID;
      local_a8.id = this->node[iVar16].id;
      pWVar1 = this->node + iVar16;
      local_a8.x = pWVar1->x;
      local_a8.y = pWVar1->y;
      local_a8.energy = pWVar1->energy;
      pSVar2 = &this->node[iVar16].color;
      local_a8.color.super_Vec<double,_4>.super_Matx<double,_4,_1>.val[0] =
           (pSVar2->super_Vec<double,_4>).super_Matx<double,_4,_1>.val[0];
      local_a8.color.super_Vec<double,_4>.super_Matx<double,_4,_1>.val[1] =
           (pSVar2->super_Vec<double,_4>).super_Matx<double,_4,_1>.val[1];
      pdVar3 = this->node[iVar16].color.super_Vec<double,_4>.super_Matx<double,_4,_1>.val + 2;
      local_a8.color.super_Vec<double,_4>.super_Matx<double,_4,_1>.val[2] = *pdVar3;
      local_a8.color.super_Vec<double,_4>.super_Matx<double,_4,_1>.val[3] = pdVar3[1];
      pWVar18 = (WSNTopologyBasedEnergy *)(local_70 + 0x20);
      this_01 = pWVar18;
      WSNNode::NodeColor((Scalar *)pWVar18,this->node + iVar16);
      drawCrossNode(this_01,&this->img,&local_a8,(Scalar *)pWVar18);
      WSNNode::~WSNNode(&local_a8);
      local_6f8._0_8_ = ppSVar15;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_6f8,"WSN","");
      local_720.sz.width = 0;
      local_720.sz.height = 0;
      local_720.flags = 0x1010000;
      local_720.obj = this;
      cv::imshow((string *)&local_6f8,&local_720);
      if ((Size **)local_6f8._0_8_ != ppSVar15) {
        operator_delete((void *)local_6f8._0_8_,(long)local_6f8.sz + 1);
      }
      cv::Mat::~Mat((Mat *)local_3c8);
      local_740 = local_740 + 1;
    } while (local_740 !=
             local_678.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
             ._M_finish);
  }
  pWVar19 = this->node;
  lVar17 = 100;
  do {
    local_e8.leaderID = pWVar19->leaderID;
    local_e8.id = pWVar19->id;
    local_e8.x = pWVar19->x;
    local_e8.y = pWVar19->y;
    local_e8.energy = pWVar19->energy;
    local_e8.color.super_Vec<double,_4>.super_Matx<double,_4,_1>.val[0] =
         (pWVar19->color).super_Vec<double,_4>.super_Matx<double,_4,_1>.val[0];
    local_e8.color.super_Vec<double,_4>.super_Matx<double,_4,_1>.val[1] =
         (pWVar19->color).super_Vec<double,_4>.super_Matx<double,_4,_1>.val[1];
    local_e8.color.super_Vec<double,_4>.super_Matx<double,_4,_1>.val[2] =
         (pWVar19->color).super_Vec<double,_4>.super_Matx<double,_4,_1>.val[2];
    local_e8.color.super_Vec<double,_4>.super_Matx<double,_4,_1>.val[3] =
         (pWVar19->color).super_Vec<double,_4>.super_Matx<double,_4,_1>.val[3];
    pWVar18 = (WSNTopologyBasedEnergy *)local_70;
    WSNNode::NodeColor((Scalar *)local_70,pWVar19);
    drawCrossNode(pWVar18,&this->img,&local_e8,(Scalar *)local_70);
    WSNNode::~WSNNode(&local_e8);
    local_3c8[0] = local_3b8;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_3c8,"WSN","");
    local_6f8.sz.width = 0;
    local_6f8.sz.height = 0;
    local_6f8.flags = 0x1010000;
    local_6f8.obj = this;
    cv::imshow((string *)local_3c8,&local_6f8);
    if (local_3c8[0] != local_3b8) {
      operator_delete(local_3c8[0],local_3b8[0] + 1);
    }
    pWVar19 = pWVar19 + 1;
    lVar17 = lVar17 + -1;
  } while (lVar17 != 0);
  if (this->Test != false) {
    cv::waitKey(400);
  }
  if (local_678.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start != (int *)0x0) {
    operator_delete(local_678.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_678.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_678.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

void WSNTopologyBasedEnergy::TopLayer3SentSink()
{
	vector<int>::iterator it;
	vector<int> _array=SelectServalNode();
	for(it=_array.begin();it!=_array.end();it++)
	{
		Mat tempimg=img.clone();

		//选择每层的leader节点
		SelectLeaderID();


		// 链接所有leader节点
		line(tempimg,Point(0,0),Point(LayerLeaderNode[3].x,LayerLeaderNode[3].y),Scalar(45,150,45),1,8,0);//用黑绿色直线连接sink节点和顶层节点
		for(int i=0;i<LayerNum-1;i++)
		{
			line(tempimg,Point(LayerLeaderNode[i].x,LayerLeaderNode[i].y),Point(LayerLeaderNode[i+1].x,LayerLeaderNode[i+1].y),Scalar(0,255,0));
			imshow("WSN",tempimg);
		}
		if(true==Test) waitKey(100);


		//计算能量变化值
		if(0==node[*it].layer())
		{
			node[LayerLeaderNode[0].GetNodeID()].energy-=1+alpha * SDistanceBetweenNodes(LayerLeaderNode[0],LayerLeaderNode[1]);
			node[*it].energy-=0.5+alpha * SDistanceBetweenNodes(node[*it],LayerLeaderNode[0]);
			node[LayerLeaderNode[1].GetNodeID()].energy-=1;
			node[LayerLeaderNode[2].GetNodeID()].energy-=1;
			node[LayerLeaderNode[3].GetNodeID()].energy-=1;
		}
		else if(1==node[*it].layer())
		{
			node[LayerLeaderNode[1].GetNodeID()].energy-=1+alpha * SDistanceBetweenNodes(LayerLeaderNode[1],LayerLeaderNode[2]);
			node[*it].energy-=0.5+alpha * SDistanceBetweenNodes(node[*it],LayerLeaderNode[1]);
			node[LayerLeaderNode[2].GetNodeID()].energy-=1;
			node[LayerLeaderNode[3].GetNodeID()].energy-=1;
		}
		else if(2==node[*it].layer())
		{
			node[LayerLeaderNode[2].GetNodeID()].energy-=1+alpha * SDistanceBetweenNodes(LayerLeaderNode[2],LayerLeaderNode[3]);
			node[*it].energy-=0.5+alpha * SDistanceBetweenNodes(node[*it],LayerLeaderNode[2]);
			node[LayerLeaderNode[3].GetNodeID()].energy-=1;
		}

		else if(3==node[*it].layer())
		{
			node[LayerLeaderNode[3].GetNodeID()].energy-=1+alpha * SDistanceBetweenNodes(LayerLeaderNode[3],sink);
			node[*it].energy-=0.5+alpha * SDistanceBetweenNodes(node[*it],LayerLeaderNode[3]);
		}
		else 
		{
			node[LayerLeaderNode[4].GetNodeID()].energy-=1+alpha * SDistanceBetweenNodes(LayerLeaderNode[4],LayerLeaderNode[3]);
			node[*it].energy-=0.5+alpha * SDistanceBetweenNodes(node[*it],LayerLeaderNode[4]);
			node[LayerLeaderNode[3].GetNodeID()].energy-=1;
		}

		//不同的能量的节点画不同的颜色
		drawCrossNode(img,node[*it],node[*it].NodeColor());
		imshow("WSN",img);	
	}
	//Leader节点的颜色变化
	for(int i=0;i<NODENUM;i++)
	{
		drawCrossNode(img,node[i],node[i].NodeColor());
		imshow("WSN",img);
	}
	if(true==Test) waitKey(400);   //两次发送的时间间隔
}